

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O0

void __thiscall Imf_3_4::Image::Image(Image *this)

{
  undefined8 *in_RDI;
  Vec2<int> *maxT;
  Vec2<int> *this_00;
  Box<Imath_3_2::Vec2<int>_> *this_01;
  Box<Imath_3_2::Vec2<int>_> local_18;
  
  *in_RDI = &PTR__Image_00147b50;
  maxT = (Vec2<int> *)(in_RDI + 1);
  this_00 = &local_18.max;
  Imath_3_2::Vec2<int>::Vec2(this_00,0,0);
  this_01 = &local_18;
  Imath_3_2::Vec2<int>::Vec2(&this_01->min,-1,-1);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(this_01,this_00,maxT);
  *(undefined4 *)(in_RDI + 3) = 0;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_4::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_4::Image::ChannelInfo>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_4::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_4::Image::ChannelInfo>_>_>
         *)0x13243a);
  Array2D<Imf_3_4::ImageLevel_*>::Array2D((Array2D<Imf_3_4::ImageLevel_*> *)(in_RDI + 10));
  return;
}

Assistant:

Image::Image ()
    : _dataWindow (Box2i (V2i (0, 0), V2i (-1, -1)))
    , _levelMode (ONE_LEVEL)
    , _levelRoundingMode (ROUND_DOWN)
    , _channels ()
    , _levels ()
{
    // empty
}